

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sem_wait.c
# Opt level: O0

int nsync_sem_wait_with_cancel_(waiter *w,nsync_time abs_deadline,nsync_note cancel_note)

{
  nsync_time abs_deadline_00;
  nsync_time a;
  nsync_time b;
  nsync_time a_00;
  int iVar1;
  uint32_t uVar2;
  nsync_dll_list_ pnVar3;
  __time_t _Stack_98;
  int deadline_is_nearer;
  nsync_time local_abs_deadline;
  nsync_waiter_s nw;
  __time_t local_40;
  nsync_time cancel_time;
  int sem_outcome;
  nsync_note cancel_note_local;
  waiter *w_local;
  nsync_time abs_deadline_local;
  
  if (cancel_note == (nsync_note)0x0) {
    cancel_time.tv_nsec._4_4_ = nsync_mu_semaphore_p_with_deadline(&w->sem,abs_deadline);
  }
  else {
    join_0x00000010_0x00000000_ = nsync_note_notified_deadline_(cancel_note);
    cancel_time.tv_nsec._4_4_ = 0x7d;
    iVar1 = nsync_time_cmp(join_0x00000010_0x00000000_,(nsync_time)ZEXT816((ulong)0));
    if (0 < iVar1) {
      local_abs_deadline.tv_nsec._0_4_ = 0x726d2ba9;
      nw._32_8_ = &w->sem;
      nsync_dll_init_((nsync_dll_element_ *)&nw,&local_abs_deadline.tv_nsec);
      nw.q.container._0_4_ = 1;
      nw.sem._0_4_ = 0;
      nsync_mu_lock(&cancel_note->note_mu);
      uVar2 = atm_load_acq_u32_(&cancel_note->notified);
      if (uVar2 == 0) {
        if (cancel_note->expiry_time_valid == 0) {
          local_40 = 0x7fffffffffffffff;
          cancel_time.tv_sec = 999999999;
        }
        else {
          local_40 = (cancel_note->expiry_time).tv_sec;
          cancel_time.tv_sec = (cancel_note->expiry_time).tv_nsec;
        }
      }
      else {
        local_40 = 0;
        cancel_time.tv_sec = 0;
      }
      a.tv_nsec = cancel_time.tv_sec;
      a.tv_sec = local_40;
      iVar1 = nsync_time_cmp(a,(nsync_time)ZEXT816((ulong)0));
      if (0 < iVar1) {
        pnVar3 = nsync_dll_make_last_in_list_(cancel_note->waiters,(nsync_dll_element_ *)&nw);
        cancel_note->waiters = pnVar3;
        _Stack_98 = local_40;
        local_abs_deadline.tv_sec = cancel_time.tv_sec;
        b.tv_nsec = cancel_time.tv_sec;
        b.tv_sec = local_40;
        iVar1 = nsync_time_cmp(abs_deadline,b);
        if (iVar1 < 0) {
          _Stack_98 = abs_deadline.tv_sec;
          local_abs_deadline.tv_sec = abs_deadline.tv_nsec;
        }
        nsync_mu_unlock(&cancel_note->note_mu);
        abs_deadline_00.tv_nsec = local_abs_deadline.tv_sec;
        abs_deadline_00.tv_sec = _Stack_98;
        cancel_time.tv_nsec._4_4_ = nsync_mu_semaphore_p_with_deadline(&w->sem,abs_deadline_00);
        if ((cancel_time.tv_nsec._4_4_ == 0x6e) && (iVar1 >= 0)) {
          cancel_time.tv_nsec._4_4_ = 0x7d;
          nsync_note_notify(cancel_note);
        }
        nsync_mu_lock(&cancel_note->note_mu);
        uVar2 = atm_load_acq_u32_(&cancel_note->notified);
        if (uVar2 == 0) {
          if (cancel_note->expiry_time_valid == 0) {
            local_40 = 0x7fffffffffffffff;
            cancel_time.tv_sec = 999999999;
          }
          else {
            local_40 = (cancel_note->expiry_time).tv_sec;
            cancel_time.tv_sec = (cancel_note->expiry_time).tv_nsec;
          }
        }
        else {
          local_40 = 0;
          cancel_time.tv_sec = 0;
        }
        a_00.tv_nsec = cancel_time.tv_sec;
        a_00.tv_sec = local_40;
        iVar1 = nsync_time_cmp(a_00,(nsync_time)ZEXT816((ulong)0));
        if (0 < iVar1) {
          pnVar3 = nsync_dll_remove_(cancel_note->waiters,(nsync_dll_element_ *)&nw);
          cancel_note->waiters = pnVar3;
        }
      }
      nsync_mu_unlock(&cancel_note->note_mu);
    }
  }
  return cancel_time.tv_nsec._4_4_;
}

Assistant:

NSYNC_CPP_START_

/* Wait until one of:
     w->sem is non-zero----decrement it and return 0.
     abs_deadline expires---return ETIMEDOUT.
     cancel_note is non-NULL and *cancel_note becomes notified---return ECANCELED. */
int nsync_sem_wait_with_cancel_ (waiter *w, nsync_time abs_deadline,
			         nsync_note cancel_note) {
	int sem_outcome;
	if (cancel_note == NULL) {
		sem_outcome = nsync_mu_semaphore_p_with_deadline (&w->sem, abs_deadline);
	} else {
		nsync_time cancel_time;
		cancel_time = nsync_note_notified_deadline_ (cancel_note);
		sem_outcome = ECANCELED;
		if (nsync_time_cmp (cancel_time, nsync_time_zero) > 0) {
			struct nsync_waiter_s nw;
			nw.tag = NSYNC_WAITER_TAG;
			nw.sem = &w->sem;
			nsync_dll_init_ (&nw.q, &nw);
			ATM_STORE (&nw.waiting, 1);
			nw.flags = 0;
			nsync_mu_lock (&cancel_note->note_mu);
			cancel_time = NOTIFIED_TIME (cancel_note);
			if (nsync_time_cmp (cancel_time, nsync_time_zero) > 0) {
				nsync_time local_abs_deadline;
				int deadline_is_nearer = 0;
				cancel_note->waiters = nsync_dll_make_last_in_list_ (
					cancel_note->waiters, &nw.q);
				local_abs_deadline = cancel_time;
				if (nsync_time_cmp (abs_deadline, cancel_time) < 0) {
					local_abs_deadline = abs_deadline;
					deadline_is_nearer = 1;
				}
				nsync_mu_unlock (&cancel_note->note_mu);
				sem_outcome = nsync_mu_semaphore_p_with_deadline (&w->sem,
					local_abs_deadline);
				if (sem_outcome == ETIMEDOUT && !deadline_is_nearer) {
					sem_outcome = ECANCELED;
					nsync_note_notify (cancel_note);
				}
				nsync_mu_lock (&cancel_note->note_mu);
				cancel_time = NOTIFIED_TIME (cancel_note);
				if (nsync_time_cmp (cancel_time,
						    nsync_time_zero) > 0) {
					cancel_note->waiters = nsync_dll_remove_ (
						cancel_note->waiters, &nw.q);
				}
			}
			nsync_mu_unlock (&cancel_note->note_mu);
		}
	}
	return (sem_outcome);
}